

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::InitializeFromCommand(cmCTest *this,cmCTestStartCommand *command)

{
  bool bVar1;
  int iVar2;
  pointer pPVar3;
  cmMakefile *this_00;
  ulong uVar4;
  ostream *poVar5;
  char *pcVar6;
  string local_540 [32];
  string local_520;
  string local_500;
  undefined1 local_4e0 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  undefined4 local_2ec;
  undefined1 local_2e8 [8];
  string m;
  string local_2c0 [7];
  bool readit;
  undefined1 local_2a0 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_128 [8];
  string bld_dir_fname;
  string src_dir_fname;
  string fname;
  cmMakefile *mf;
  Part p;
  undefined1 local_98 [8];
  string bld_dir;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string src_dir;
  cmCTestStartCommand *command_local;
  cmCTest *this_local;
  
  src_dir.field_2._8_8_ = command;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"SourceDirectory",&local_61);
  GetCTestConfiguration((string *)local_40,this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,"BuildDirectory",(allocator<char> *)((long)&mf + 7));
  GetCTestConfiguration((string *)local_98,this,(string *)&p);
  std::__cxx11::string::~string((string *)&p);
  std::allocator<char>::~allocator((allocator<char> *)((long)&mf + 7));
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::__cxx11::string::operator=((string *)&pPVar3->BuildID,"");
  for (mf._0_4_ = 0; (uint)mf != 0xc; mf._0_4_ = (uint)mf + 1) {
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pPVar3->Parts[(uint)mf].SubmitFiles);
  }
  this_00 = cmCommand::GetMakefile((cmCommand *)src_dir.field_2._8_8_);
  std::__cxx11::string::string((string *)(src_dir_fname.field_2._M_local_buf + 8));
  cmStrCat<std::__cxx11::string&,char_const(&)[19]>
            ((string *)((long)&bld_dir_fname.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (char (*) [19])"/CTestConfig.cmake");
  cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)&bld_dir_fname.field_2 + 8));
  cmStrCat<std::__cxx11::string&,char_const(&)[19]>
            ((string *)local_128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
             (char (*) [19])"/CTestConfig.cmake");
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_128);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_128);
  if (bVar1) {
    std::__cxx11::string::operator=
              ((string *)(src_dir_fname.field_2._M_local_buf + 8),(string *)local_128);
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists((string *)((long)&bld_dir_fname.field_2 + 8));
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)(src_dir_fname.field_2._M_local_buf + 8),
                 (string *)(bld_dir_fname.field_2._M_local_buf + 8));
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
    poVar5 = std::operator<<((ostream *)local_2a0,"   Reading ctest configuration file: ");
    poVar5 = std::operator<<(poVar5,(string *)(src_dir_fname.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmCTestStartCommand::ShouldBeQuiet((cmCTestStartCommand *)src_dir.field_2._8_8_);
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x2a6,pcVar6,bVar1);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
    m.field_2._M_local_buf[0xf] =
         cmMakefile::ReadDependentFile(this_00,(string *)((long)&src_dir_fname.field_2 + 8),true);
    if (!(bool)m.field_2._M_local_buf[0xf]) {
      cmStrCat<char_const(&)[30],std::__cxx11::string&>
                ((string *)local_2e8,(char (*) [30])"Could not find include file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&src_dir_fname.field_2 + 8));
      cmCommand::SetError((cmCommand *)src_dir.field_2._8_8_,(string *)local_2e8);
      this_local._7_1_ = false;
      local_2ec = 1;
      std::__cxx11::string::~string((string *)local_2e8);
      goto LAB_001fc016;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"CTEST_NIGHTLY_START_TIME",&local_311);
  bVar1 = cmCTestStartCommand::ShouldBeQuiet((cmCTestStartCommand *)src_dir.field_2._8_8_);
  SetCTestConfigurationFromCMakeVariable(this,this_00,"NightlyStartTime",&local_310,bVar1);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"CTEST_SITE",&local_339);
  bVar1 = cmCTestStartCommand::ShouldBeQuiet((cmCTestStartCommand *)src_dir.field_2._8_8_);
  SetCTestConfigurationFromCMakeVariable(this,this_00,"Site",&local_338,bVar1);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"CTEST_BUILD_NAME",&local_361);
  bVar1 = cmCTestStartCommand::ShouldBeQuiet((cmCTestStartCommand *)src_dir.field_2._8_8_);
  SetCTestConfigurationFromCMakeVariable(this,this_00,"BuildName",&local_360,bVar1);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  iVar2 = Initialize(this,(string *)local_98,(cmCTestStartCommand *)src_dir.field_2._8_8_);
  if (iVar2 == 0) {
    this_local._7_1_ = false;
    local_2ec = 1;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e0);
    poVar5 = std::operator<<((ostream *)local_4e0,"   Use ");
    GetTestModelString_abi_cxx11_(&local_500,this);
    poVar5 = std::operator<<(poVar5,(string *)&local_500);
    poVar5 = std::operator<<(poVar5," tag: ");
    GetCurrentTag_abi_cxx11_(&local_520,this);
    poVar5 = std::operator<<(poVar5,(string *)&local_520);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmCTestStartCommand::ShouldBeQuiet((cmCTestStartCommand *)src_dir.field_2._8_8_);
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x2bd,pcVar6,bVar1);
    std::__cxx11::string::~string(local_540);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e0);
    this_local._7_1_ = true;
    local_2ec = 1;
  }
LAB_001fc016:
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)(bld_dir_fname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(src_dir_fname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmCTest::InitializeFromCommand(cmCTestStartCommand* command)
{
  std::string src_dir = this->GetCTestConfiguration("SourceDirectory");
  std::string bld_dir = this->GetCTestConfiguration("BuildDirectory");
  this->Impl->BuildID = "";
  for (Part p = PartStart; p != PartCount; p = static_cast<Part>(p + 1)) {
    this->Impl->Parts[p].SubmitFiles.clear();
  }

  cmMakefile* mf = command->GetMakefile();
  std::string fname;

  std::string src_dir_fname = cmStrCat(src_dir, "/CTestConfig.cmake");
  cmSystemTools::ConvertToUnixSlashes(src_dir_fname);

  std::string bld_dir_fname = cmStrCat(bld_dir, "/CTestConfig.cmake");
  cmSystemTools::ConvertToUnixSlashes(bld_dir_fname);

  if (cmSystemTools::FileExists(bld_dir_fname)) {
    fname = bld_dir_fname;
  } else if (cmSystemTools::FileExists(src_dir_fname)) {
    fname = src_dir_fname;
  }

  if (!fname.empty()) {
    cmCTestOptionalLog(this, OUTPUT,
                       "   Reading ctest configuration file: " << fname
                                                               << std::endl,
                       command->ShouldBeQuiet());
    bool readit = mf->ReadDependentFile(fname);
    if (!readit) {
      std::string m = cmStrCat("Could not find include file: ", fname);
      command->SetError(m);
      return false;
    }
  }

  this->SetCTestConfigurationFromCMakeVariable(mf, "NightlyStartTime",
                                               "CTEST_NIGHTLY_START_TIME",
                                               command->ShouldBeQuiet());
  this->SetCTestConfigurationFromCMakeVariable(mf, "Site", "CTEST_SITE",
                                               command->ShouldBeQuiet());
  this->SetCTestConfigurationFromCMakeVariable(
    mf, "BuildName", "CTEST_BUILD_NAME", command->ShouldBeQuiet());

  if (!this->Initialize(bld_dir, command)) {
    return false;
  }
  cmCTestOptionalLog(this, OUTPUT,
                     "   Use " << this->GetTestModelString() << " tag: "
                               << this->GetCurrentTag() << std::endl,
                     command->ShouldBeQuiet());
  return true;
}